

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool ReadLinsData(string *DataFile,VecVector3d *Accel,VecVector3d *Gyro)

{
  pointer *ppMVar1;
  uint uVar2;
  iterator iVar3;
  char cVar4;
  istream *piVar5;
  undefined1 auVar6 [16];
  Vector3d Gyro_temp;
  Vector3d Accel_temp;
  string line;
  long SOW;
  long week;
  ifstream in;
  stringstream buff;
  undefined1 local_428 [16];
  double local_418;
  Matrix<double,_3,_1,_0,_3,_1> local_408;
  char *local_3f0;
  long local_3e8;
  char local_3e0 [32];
  long local_3c0 [4];
  uint auStack_3a0 [122];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::ifstream::ifstream((string *)local_3c0);
  std::ifstream::open((string *)local_3c0,(_Ios_Openmode)DataFile);
  uVar2 = *(uint *)((long)auStack_3a0 + *(long *)(local_3c0[0] + -0x18));
  if ((uVar2 & 5) == 0) {
    if ((*(byte *)((long)auStack_3a0 + *(long *)(local_3c0[0] + -0x18)) & 2) == 0) {
      do {
        local_3e8 = 0;
        local_3e0[0] = '\0';
        local_3f0 = local_3e0;
        std::__cxx11::stringstream::stringstream(local_1b8);
        cVar4 = std::ios::widen((char)*(undefined8 *)(local_3c0[0] + -0x18) +
                                (char)(string *)local_3c0);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3c0,(string *)&local_3f0,cVar4);
        if (*local_3f0 != 'm') {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3f0,local_3e8);
          piVar5 = std::istream::_M_extract<long>((long *)local_1b8);
          piVar5 = std::istream::_M_extract<long>((long *)piVar5);
          piVar5 = std::istream::_M_extract<double>((double *)piVar5);
          piVar5 = std::istream::_M_extract<double>((double *)piVar5);
          piVar5 = std::istream::_M_extract<double>((double *)piVar5);
          piVar5 = std::istream::_M_extract<double>((double *)piVar5);
          piVar5 = std::istream::_M_extract<double>((double *)piVar5);
          std::istream::_M_extract<double>((double *)piVar5);
          local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0] * 9.7936174;
          local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1] * 9.7936174;
          local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2] * -9.7936174;
          auVar6._0_8_ = (double)local_428._0_8_ * (double)DAT_0010c370;
          auVar6._8_8_ = (double)local_428._8_8_ * DAT_0010c370._8_8_;
          auVar6 = divpd(auVar6,_DAT_0010c380);
          local_428 = divpd(auVar6,_DAT_0010c370);
          local_418 = ((local_418 * -3600.0) / 206264.80624709636) / 3600.0;
          iVar3._M_current =
               (Accel->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (Accel->
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
            ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>const&>
                      ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                        *)Accel,iVar3,&local_408);
          }
          else {
            ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[2] =
                 local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
            ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[0] =
                 local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
            ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[1] =
                 local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
            ppMVar1 = &(Accel->
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppMVar1 = *ppMVar1 + 1;
          }
          iVar3._M_current =
               (Gyro->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (Gyro->
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
            ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>const&>
                      ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                        *)Gyro,iVar3,(Matrix<double,_3,_1,_0,_3,_1> *)local_428);
          }
          else {
            ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[2] = local_418;
            ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[0] = (double)local_428._0_8_;
            ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[1] = (double)local_428._8_8_;
            ppMVar1 = &(Gyro->
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppMVar1 = *ppMVar1 + 1;
          }
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        if (local_3f0 != local_3e0) {
          operator_delete(local_3f0);
        }
      } while ((*(byte *)((long)auStack_3a0 + *(long *)(local_3c0[0] + -0x18)) & 2) == 0);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"open file error",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  }
  std::ifstream::~ifstream(local_3c0);
  return (uVar2 & 5) == 0;
}

Assistant:

bool ReadLinsData(const string DataFile, VecVector3d &Accel, VecVector3d &Gyro)
{
    ifstream in;
    in.open(DataFile);
    if(!in)
    {
        cout << "open file error" << endl;
        return false;
    }

    while(!in.eof())
    {
        string line;
        stringstream buff;
        getline(in, line);
        if(line[0] == 'm')
            continue;
        long int week, SOW;
        Vector3d Accel_temp, Gyro_temp;

        buff << line;
        buff >> week >> SOW >> Gyro_temp[1] >> Gyro_temp[0] >> Gyro_temp[2]
             >> Accel_temp[1] >> Accel_temp[0] >> Accel_temp[2];

        Accel_temp[0] = (Accel_temp[0] * GRAVITY);
        Accel_temp[1] = (Accel_temp[1] * GRAVITY);
        Accel_temp[2] = -(Accel_temp[2] * GRAVITY);
        
        Gyro_temp[0] = Deg2Rad((Gyro_temp[0])) / 3600.0;
        Gyro_temp[1] = Deg2Rad((Gyro_temp[1])) / 3600.0;
        Gyro_temp[2] = Deg2Rad(-(Gyro_temp[2])) / 3600.0;

        Accel.push_back(Accel_temp);
        Gyro.push_back(Gyro_temp);
    }

    return true;
}